

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O0

int X509V3_EXT_REQ_add_nconf(CONF *conf,X509V3_CTX *ctx,char *section,X509_REQ *req)

{
  int iVar1;
  stack_st_X509_EXTENSION **ppsStack_40;
  int i;
  stack_st_X509_EXTENSION **sk;
  stack_st_X509_EXTENSION *extlist;
  X509_REQ *req_local;
  char *section_local;
  X509V3_CTX *ctx_local;
  CONF *conf_local;
  
  sk = (stack_st_X509_EXTENSION **)0x0;
  ppsStack_40 = (stack_st_X509_EXTENSION **)0x0;
  if (req != (X509_REQ *)0x0) {
    ppsStack_40 = (stack_st_X509_EXTENSION **)&sk;
  }
  extlist = (stack_st_X509_EXTENSION *)req;
  req_local = (X509_REQ *)section;
  section_local = (char *)ctx;
  ctx_local = (X509V3_CTX *)conf;
  conf_local._4_4_ = X509V3_EXT_add_nconf_sk(conf,ctx,section,ppsStack_40);
  if ((conf_local._4_4_ != 0) && (ppsStack_40 != (stack_st_X509_EXTENSION **)0x0)) {
    iVar1 = X509_REQ_add_extensions((X509_REQ *)extlist,(stack_st_X509_EXTENSION *)sk);
    sk_X509_EXTENSION_pop_free((stack_st_X509_EXTENSION *)sk,X509_EXTENSION_free);
    conf_local._4_4_ = iVar1;
  }
  return conf_local._4_4_;
}

Assistant:

int X509V3_EXT_REQ_add_nconf(const CONF *conf, const X509V3_CTX *ctx,
                             const char *section, X509_REQ *req) {
  STACK_OF(X509_EXTENSION) *extlist = NULL, **sk = NULL;
  int i;
  if (req) {
    sk = &extlist;
  }
  i = X509V3_EXT_add_nconf_sk(conf, ctx, section, sk);
  if (!i || !sk) {
    return i;
  }
  i = X509_REQ_add_extensions(req, extlist);
  sk_X509_EXTENSION_pop_free(extlist, X509_EXTENSION_free);
  return i;
}